

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O0

bool __thiscall
World::collidesWithQuads(World *this,vector<Quad_*,_std::allocator<Quad_*>_> *quads,Vec2d *offset)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  reference ppQVar4;
  Vec2d **ppVVar5;
  ostream *poVar6;
  float fVar7;
  float fVar8;
  string local_78;
  Vec2d *local_58;
  Vec2d *vertex;
  Quad *pQStack_48;
  int i;
  Quad *quad;
  iterator __end1;
  iterator __begin1;
  vector<Quad_*,_std::allocator<Quad_*>_> *__range1;
  Vec2d *offset_local;
  vector<Quad_*,_std::allocator<Quad_*>_> *quads_local;
  World *this_local;
  
  __end1 = std::vector<Quad_*,_std::allocator<Quad_*>_>::begin(quads);
  quad = (Quad *)std::vector<Quad_*,_std::allocator<Quad_*>_>::end(quads);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Quad_**,_std::vector<Quad_*,_std::allocator<Quad_*>_>_>
                                *)&quad);
    if (!bVar2) {
      return false;
    }
    ppQVar4 = __gnu_cxx::__normal_iterator<Quad_**,_std::vector<Quad_*,_std::allocator<Quad_*>_>_>::
              operator*(&__end1);
    pQStack_48 = *ppQVar4;
    for (vertex._4_4_ = 0; iVar1 = vertex._4_4_, iVar3 = Quad::getVertexCount(pQStack_48),
        iVar1 < iVar3; vertex._4_4_ = vertex._4_4_ + 1) {
      ppVVar5 = Quad::getVertices(pQStack_48);
      local_58 = Vec2d::getOffset(ppVVar5[vertex._4_4_],offset);
      fVar7 = Vec2d::getY(local_58);
      if (fVar7 < 0.0) {
LAB_00136c8f:
        poVar6 = std::operator<<((ostream *)&std::cout,"Collision with world ");
        Vec2d::toString_abi_cxx11_(&local_78,local_58);
        poVar6 = std::operator<<(poVar6,(string *)&local_78);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_78);
        if (local_58 != (Vec2d *)0x0) {
          operator_delete(local_58);
        }
        return true;
      }
      fVar7 = Vec2d::getY(local_58);
      fVar8 = Vec2d::getY(this->bounds);
      if ((fVar8 < fVar7) || (fVar7 = Vec2d::getX(local_58), fVar7 < 0.0)) goto LAB_00136c8f;
      fVar7 = Vec2d::getX(local_58);
      fVar8 = Vec2d::getX(this->bounds);
      if (fVar8 < fVar7) goto LAB_00136c8f;
      if (local_58 != (Vec2d *)0x0) {
        operator_delete(local_58);
      }
    }
    __gnu_cxx::__normal_iterator<Quad_**,_std::vector<Quad_*,_std::allocator<Quad_*>_>_>::operator++
              (&__end1);
  } while( true );
}

Assistant:

bool World::collidesWithQuads(vector<Quad*>* quads, Vec2d* offset) {
    for (auto quad : *quads) {
        for (int i = 0; i < quad->getVertexCount(); i++) {
            Vec2d* vertex = quad->getVertices()[i]->getOffset(offset);
            if (vertex->getY() < 0 || vertex->getY() > bounds->getY() || vertex->getX() < 0 || vertex->getX() > bounds->getX()) {
                cout << "Collision with world " << vertex->toString() << endl;
                delete vertex;
                return true;
            }
            delete vertex;
        }
    }
    return false;
}